

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O3

bool __thiscall spvtools::opt::SENode::operator==(SENode *this,SENode *other)

{
  pointer ppSVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar5;
  long lVar6;
  
  iVar3 = (**this->_vptr_SENode)();
  iVar4 = (**other->_vptr_SENode)(other);
  if ((iVar3 == iVar4) &&
     ((long)(other->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(other->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)(this->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_start)) {
    iVar3 = (*this->_vptr_SENode[7])(this);
    lVar5 = CONCAT44(extraout_var,iVar3);
    if (lVar5 == 0) {
      ppSVar1 = (this->children_).
                super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(this->children_).
                    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1;
      if (lVar5 != 0) {
        lVar5 = lVar5 >> 3;
        lVar6 = 0;
        do {
          if ((other->children_).
              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar6] != ppSVar1[lVar6]) goto LAB_00601bae;
          lVar6 = lVar6 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
      }
    }
    else {
      iVar3 = (*other->_vptr_SENode[7])(other);
      lVar6 = CONCAT44(extraout_var_00,iVar3);
      if (lVar6 == 0) {
        __assert_fail("other_as_recurrent",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                      ,0x204,"bool spvtools::opt::SENode::operator==(const SENode &) const");
      }
      if (((*(long *)(lVar5 + 0x30) != *(long *)(lVar6 + 0x30)) ||
          (*(long *)(lVar5 + 0x38) != *(long *)(lVar6 + 0x38))) ||
         (*(long *)(lVar5 + 0x40) != *(long *)(lVar6 + 0x40))) goto LAB_00601bae;
    }
    iVar3 = (**this->_vptr_SENode)(this);
    if (iVar3 == 5) {
      iVar3 = (*this->_vptr_SENode[0xf])(this);
      iVar3 = *(int *)(CONCAT44(extraout_var_01,iVar3) + 0x2c);
      iVar4 = (*other->_vptr_SENode[0xf])(other);
      if (iVar3 != *(int *)(CONCAT44(extraout_var_02,iVar4) + 0x2c)) goto LAB_00601bae;
    }
    iVar3 = (*this->_vptr_SENode[5])(this);
    if (CONCAT44(extraout_var_03,iVar3) != 0) {
      iVar3 = (*this->_vptr_SENode[5])(this);
      lVar5 = *(long *)(CONCAT44(extraout_var_04,iVar3) + 0x30);
      iVar3 = (*other->_vptr_SENode[5])(other);
      if (lVar5 != *(long *)(CONCAT44(extraout_var_05,iVar3) + 0x30)) goto LAB_00601bae;
    }
    bVar2 = true;
  }
  else {
LAB_00601bae:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SENode::operator==(const SENode& other) const {
  if (GetType() != other.GetType()) return false;

  if (other.GetChildren().size() != children_.size()) return false;

  const SERecurrentNode* this_as_recurrent = AsSERecurrentNode();

  // Check the children are the same, for SERecurrentNodes we need to check the
  // offset and coefficient manually as the child vector is sorted by ids so the
  // offset/coefficient information is lost.
  if (!this_as_recurrent) {
    for (size_t index = 0; index < children_.size(); ++index) {
      if (other.GetChildren()[index] != children_[index]) return false;
    }
  } else {
    const SERecurrentNode* other_as_recurrent = other.AsSERecurrentNode();

    // We've already checked the types are the same, this should not fail if
    // this->AsSERecurrentNode() succeeded.
    assert(other_as_recurrent);

    if (this_as_recurrent->GetCoefficient() !=
        other_as_recurrent->GetCoefficient())
      return false;

    if (this_as_recurrent->GetOffset() != other_as_recurrent->GetOffset())
      return false;

    if (this_as_recurrent->GetLoop() != other_as_recurrent->GetLoop())
      return false;
  }

  // If we're dealing with a value unknown node check both nodes were created by
  // the same instruction.
  if (GetType() == SENode::ValueUnknown) {
    if (AsSEValueUnknown()->ResultId() !=
        other.AsSEValueUnknown()->ResultId()) {
      return false;
    }
  }

  if (AsSEConstantNode()) {
    if (AsSEConstantNode()->FoldToSingleValue() !=
        other.AsSEConstantNode()->FoldToSingleValue())
      return false;
  }

  return true;
}